

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate2<std::complex<float>_>::apply
          (QGate2<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  _ComplexT _Var1;
  uint uVar2;
  complex<float> *pcVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined7 in_register_00000031;
  long lVar11;
  long lVar12;
  char *__assertion;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar27;
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  float extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  float extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dc_17;
  float extraout_XMM0_Dc_18;
  undefined4 extraout_XMM0_Dc_19;
  undefined4 extraout_XMM0_Dc_20;
  undefined4 extraout_XMM0_Dc_21;
  undefined4 extraout_XMM0_Dc_22;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  float extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  float extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 extraout_XMM0_Dd_17;
  float extraout_XMM0_Dd_18;
  undefined4 extraout_XMM0_Dd_19;
  undefined4 extraout_XMM0_Dd_20;
  undefined4 extraout_XMM0_Dd_21;
  undefined4 extraout_XMM0_Dd_22;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  float fVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  float fVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  float fVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  SquareMatrix<std::complex<float>_> mat2;
  vector<int,_std::allocator<int>_> qubits;
  SquareMatrix<std::complex<float>_> local_148;
  float local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  float fStack_90;
  float fStack_8c;
  long local_80;
  long local_78;
  ulong local_70;
  SquareMatrix<std::complex<float>_> local_68;
  SquareMatrix<std::complex<float>_> local_58;
  int *local_48 [2];
  long local_38;
  
  local_c8._0_4_ = (float)CONCAT71(in_register_00000031,side);
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[5])(local_48,this);
  iVar6 = *local_48[0] + offset;
  *local_48[0] = iVar6;
  iVar15 = offset + local_48[0][1];
  local_48[0][1] = iVar15;
  if (iVar6 < nbQubits) {
    if (iVar15 < nbQubits) {
      if (iVar6 + 1 != iVar15) {
        __assert_fail("qubits[0] + 1 == qubits[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                      ,0x29,
                      "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                     );
      }
      (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&local_148,this);
      dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&local_148);
      uVar22 = CONCAT44(local_c8._4_4_,(float)local_c8);
      if ((char)local_c8 == 'L') {
        if (nbQubits == 2) {
          dense::SquareMatrix<std::complex<float>_>::operator*=(matrix,&local_148);
          uVar22 = CONCAT44(local_c8._4_4_,(float)local_c8);
        }
        else {
          uVar2 = local_48[0][1];
          if (0 < matrix->size_) {
            lVar11 = (long)(1 << ((byte)(~uVar2 + nbQubits) & 0x1f));
            iVar6 = *local_48[0];
            uVar13 = 1 << ((byte)iVar6 & 0x1f);
            lVar12 = 1;
            if (1 < lVar11) {
              lVar12 = lVar11;
            }
            if ((int)uVar13 < 2) {
              uVar13 = 1;
            }
            uVar14 = (ulong)uVar13;
            lVar9 = lVar11 * 4;
            local_70 = lVar11 * 2;
            local_78 = lVar11 * 3;
            lVar18 = 0;
            do {
              if (iVar6 != 0x1f) {
                lVar16 = 0;
                uVar7 = 0;
                do {
                  local_c8._4_4_ = (undefined4)(uVar22 >> 0x20);
                  lVar19 = lVar12;
                  local_80 = lVar16;
                  if (~uVar2 + nbQubits != 0x1f) {
                    do {
                      local_a8._0_8_ = lVar19;
                      lVar19 = lVar11 + lVar16;
                      lVar20 = local_70 + lVar16;
                      lVar17 = local_78 + lVar16;
                      lVar8 = matrix->size_;
                      pcVar3 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      fVar36 = *(float *)&pcVar3[lVar8 * lVar16 + lVar18]._M_value;
                      fVar27 = *(float *)((long)&pcVar3[lVar8 * lVar16 + lVar18]._M_value + 4);
                      lVar10 = lVar8 * lVar19;
                      fVar21 = *(float *)&pcVar3[lVar10 + lVar18]._M_value;
                      fVar34 = *(float *)((long)&pcVar3[lVar10 + lVar18]._M_value + 4);
                      lVar10 = lVar8 * lVar20;
                      fVar28 = *(float *)&pcVar3[lVar10 + lVar18]._M_value;
                      fVar29 = *(float *)((long)&pcVar3[lVar10 + lVar18]._M_value + 4);
                      lVar8 = lVar8 * lVar17;
                      fVar31 = *(float *)&pcVar3[lVar8 + lVar18]._M_value;
                      local_c8._0_4_ = *(float *)((long)&pcVar3[lVar8 + lVar18]._M_value + 4);
                      fVar32 = (float)*(_ComplexT *)
                                       local_148.data_._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                       _M_head_impl;
                      fVar42 = (float)(*(_ComplexT *)
                                        local_148.data_._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl >> 0x20);
                      uVar48 = 0;
                      uVar49 = 0;
                      fVar47 = fVar36 * fVar32 - fVar27 * fVar42;
                      uVar51 = 0;
                      fVar50 = fVar36 * fVar42 + fVar27 * fVar32;
                      uVar23 = CONCAT44(fVar50,fVar47);
                      if ((NAN(fVar47)) && (uVar23 = CONCAT44(fVar50,fVar47), NAN(fVar50))) {
                        local_108._0_8_ = lVar11;
                        local_138 = fVar29;
                        local_128 = uVar14;
                        uVar23 = __mulsc3(fVar32,fVar42,fVar36,fVar27);
                        uVar51 = (undefined4)((ulong)uVar23 >> 0x20);
                        lVar11 = local_108._0_8_;
                        uVar14 = local_128;
                        fVar29 = local_138;
                        uVar48 = extraout_XMM0_Dc;
                        uVar49 = extraout_XMM0_Dd;
                      }
                      fVar32 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + 8))->_M_value;
                      fVar42 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + 8))->_M_value >> 0x20);
                      uVar53 = 0;
                      uVar54 = 0;
                      fVar50 = fVar21 * fVar32 - fVar34 * fVar42;
                      fVar47 = fVar21 * fVar42 + fVar34 * fVar32;
                      uVar45 = uVar51;
                      uVar40 = uVar51;
                      uVar41 = uVar51;
                      uVar22 = (ulong)(uint)fVar50;
                      uVar25 = local_e8;
                      if ((NAN(fVar50)) && (uVar22 = (ulong)(uint)fVar50, NAN(fVar47))) {
                        local_108._0_8_ = lVar11;
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar51;
                        uStack_f0 = uVar51;
                        uStack_ec = uVar51;
                        uVar22 = __mulsc3(fVar32,fVar42,fVar21,fVar34);
                        uVar23 = CONCAT44(local_f8,local_118);
                        fVar47 = (float)(uVar22 >> 0x20);
                        lVar11 = local_108._0_8_;
                        uVar14 = local_128;
                        fVar29 = local_138;
                        uVar51 = uStack_114;
                        uVar48 = uStack_110;
                        uVar49 = uStack_10c;
                        uVar45 = uStack_f4;
                        uVar40 = uStack_f0;
                        uVar41 = uStack_ec;
                        uVar53 = extraout_XMM0_Dc_00;
                        uVar54 = extraout_XMM0_Dd_00;
                        uVar25 = local_e8;
                      }
                      local_b8._4_4_ = (undefined4)(uVar22 >> 0x20);
                      fVar50 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + 0x10))->_M_value;
                      fVar33 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + 0x10))->_M_value >> 0x20);
                      fVar30 = fVar28 * fVar50 - fVar29 * fVar33;
                      fVar32 = fVar28 * fVar33 + fVar29 * fVar50;
                      local_d8 = ZEXT416((uint)fVar30);
                      local_b8._0_4_ = fVar47;
                      local_b8._8_4_ = local_b8._4_4_;
                      local_b8._12_4_ = local_b8._4_4_;
                      fVar42 = 0.0;
                      local_e8 = uVar22;
                      if ((NAN(fVar30)) && (NAN(fVar32))) {
                        local_108._0_8_ = lVar11;
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar45;
                        uStack_f0 = uVar40;
                        uStack_ec = uVar41;
                        uStack_e0 = uVar53;
                        uStack_dc = uVar54;
                        local_d8._0_8_ = __mulsc3(fVar50,fVar33,fVar28,fVar29);
                        uVar23 = CONCAT44(local_f8,local_118);
                        fVar32 = (float)((ulong)local_d8._0_8_ >> 0x20);
                        local_d8._8_4_ = extraout_XMM0_Dc_01;
                        local_d8._12_4_ = extraout_XMM0_Dd_01;
                        lVar11 = local_108._0_8_;
                        uVar14 = local_128;
                        fVar42 = fVar32;
                        fVar29 = local_138;
                        uVar51 = uStack_114;
                        uVar48 = uStack_110;
                        uVar49 = uStack_10c;
                        uVar45 = uStack_f4;
                        uVar40 = uStack_f0;
                        uVar41 = uStack_ec;
                        uVar53 = uStack_e0;
                        uVar54 = uStack_dc;
                        uVar25 = local_e8;
                      }
                      _Var1 = ((complex<float> *)
                              ((long)local_148.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 0x18))->_M_value;
                      fVar50 = (float)_Var1;
                      fVar33 = (float)(_Var1 >> 0x20);
                      fVar47 = fVar31 * fVar50 - (float)local_c8 * fVar33;
                      fVar30 = fVar31 * fVar33 + (float)local_c8 * fVar50;
                      uVar24 = CONCAT44(fVar30,fVar47);
                      if ((NAN(fVar47)) && (uVar24 = CONCAT44(fVar30,fVar47), NAN(fVar30))) {
                        local_108._0_8_ = lVar11;
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar45;
                        uStack_f0 = uVar40;
                        uStack_ec = uVar41;
                        uStack_e0 = uVar53;
                        uStack_dc = uVar54;
                        local_98._0_4_ = fVar32;
                        local_98._4_4_ = fVar42;
                        fStack_90 = fVar42;
                        fStack_8c = fVar42;
                        uVar24 = __mulsc3(fVar50,fVar33,fVar31,(float)local_c8);
                        uVar23 = CONCAT44(local_f8,local_118);
                        lVar11 = local_108._0_8_;
                        uVar14 = local_128;
                        fVar32 = (float)local_98;
                        fVar29 = local_138;
                        uVar25 = local_e8;
                      }
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [matrix->size_ * lVar16 + lVar18]._M_value =
                           CONCAT44((float)((ulong)uVar23 >> 0x20) + (float)local_b8._0_4_ + fVar32
                                    + (float)((ulong)uVar24 >> 0x20),
                                    (float)uVar23 + (float)local_e8 + (float)local_d8._0_4_ +
                                    (float)uVar24);
                      fVar32 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + local_148.size_ * 8))->_M_value;
                      fVar42 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + local_148.size_ * 8))->_M_value >> 0x20
                                      );
                      uVar48 = 0;
                      uVar49 = 0;
                      fVar47 = fVar36 * fVar32 - fVar27 * fVar42;
                      uVar51 = 0;
                      fVar50 = fVar36 * fVar42 + fVar27 * fVar32;
                      uVar23 = CONCAT44(fVar50,fVar47);
                      local_e8 = uVar25;
                      if ((NAN(fVar47)) && (uVar23 = CONCAT44(fVar50,fVar47), NAN(fVar50))) {
                        local_108._0_8_ = lVar11;
                        local_138 = fVar29;
                        local_128 = uVar14;
                        uVar23 = __mulsc3(fVar32,fVar42,fVar36,fVar27);
                        uVar51 = (undefined4)((ulong)uVar23 >> 0x20);
                        lVar11 = local_108._0_8_;
                        uVar14 = local_128;
                        fVar29 = local_138;
                        uVar48 = extraout_XMM0_Dc_02;
                        uVar49 = extraout_XMM0_Dd_02;
                      }
                      fVar32 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_148.size_ + 1) * 8))->_M_value;
                      fVar42 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_148.size_ + 1) * 8))->_M_value
                                      >> 0x20);
                      uVar53 = 0;
                      uVar54 = 0;
                      fVar50 = fVar21 * fVar32 - fVar34 * fVar42;
                      fVar47 = fVar21 * fVar42 + fVar34 * fVar32;
                      uVar45 = uVar51;
                      uVar40 = uVar51;
                      uVar41 = uVar51;
                      uVar22 = (ulong)(uint)fVar50;
                      uVar25 = local_e8;
                      if ((NAN(fVar50)) && (uVar22 = (ulong)(uint)fVar50, NAN(fVar47))) {
                        local_108._0_8_ = lVar11;
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar51;
                        uStack_f0 = uVar51;
                        uStack_ec = uVar51;
                        uVar22 = __mulsc3(fVar32,fVar42,fVar21,fVar34);
                        uVar23 = CONCAT44(local_f8,local_118);
                        fVar47 = (float)(uVar22 >> 0x20);
                        lVar11 = local_108._0_8_;
                        uVar14 = local_128;
                        fVar29 = local_138;
                        uVar51 = uStack_114;
                        uVar48 = uStack_110;
                        uVar49 = uStack_10c;
                        uVar45 = uStack_f4;
                        uVar40 = uStack_f0;
                        uVar41 = uStack_ec;
                        uVar53 = extraout_XMM0_Dc_03;
                        uVar54 = extraout_XMM0_Dd_03;
                        uVar25 = local_e8;
                      }
                      local_b8._4_4_ = (undefined4)(uVar22 >> 0x20);
                      _Var1 = ((complex<float> *)
                              ((long)local_148.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 0x10))[local_148.size_]._M_value;
                      fVar50 = (float)_Var1;
                      fVar33 = (float)(_Var1 >> 0x20);
                      fVar30 = fVar28 * fVar50 - fVar29 * fVar33;
                      fVar32 = fVar28 * fVar33 + fVar29 * fVar50;
                      local_d8 = ZEXT416((uint)fVar30);
                      local_b8._0_4_ = fVar47;
                      local_b8._8_4_ = local_b8._4_4_;
                      local_b8._12_4_ = local_b8._4_4_;
                      fVar42 = 0.0;
                      local_e8 = uVar22;
                      if ((NAN(fVar30)) && (NAN(fVar32))) {
                        local_108._0_8_ = lVar11;
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar45;
                        uStack_f0 = uVar40;
                        uStack_ec = uVar41;
                        uStack_e0 = uVar53;
                        uStack_dc = uVar54;
                        local_d8._0_8_ = __mulsc3(fVar50,fVar33,fVar28,fVar29);
                        uVar23 = CONCAT44(local_f8,local_118);
                        fVar32 = (float)((ulong)local_d8._0_8_ >> 0x20);
                        local_d8._8_4_ = extraout_XMM0_Dc_04;
                        local_d8._12_4_ = extraout_XMM0_Dd_04;
                        lVar11 = local_108._0_8_;
                        uVar14 = local_128;
                        fVar42 = fVar32;
                        fVar29 = local_138;
                        uVar51 = uStack_114;
                        uVar48 = uStack_110;
                        uVar49 = uStack_10c;
                        uVar45 = uStack_f4;
                        uVar40 = uStack_f0;
                        uVar41 = uStack_ec;
                        uVar53 = uStack_e0;
                        uVar54 = uStack_dc;
                        uVar25 = local_e8;
                      }
                      fVar50 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_148.size_ + 3) * 8))->_M_value;
                      fVar33 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_148.size_ + 3) * 8))->_M_value
                                      >> 0x20);
                      fVar47 = fVar31 * fVar50 - (float)local_c8 * fVar33;
                      fVar30 = fVar31 * fVar33 + (float)local_c8 * fVar50;
                      uVar24 = CONCAT44(fVar30,fVar47);
                      if ((NAN(fVar47)) && (uVar24 = CONCAT44(fVar30,fVar47), NAN(fVar30))) {
                        local_108._0_8_ = lVar11;
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar45;
                        uStack_f0 = uVar40;
                        uStack_ec = uVar41;
                        uStack_e0 = uVar53;
                        uStack_dc = uVar54;
                        local_98._0_4_ = fVar32;
                        local_98._4_4_ = fVar42;
                        fStack_90 = fVar42;
                        fStack_8c = fVar42;
                        uVar24 = __mulsc3(fVar50,fVar33,fVar31,(float)local_c8);
                        uVar23 = CONCAT44(local_f8,local_118);
                        lVar11 = local_108._0_8_;
                        uVar14 = local_128;
                        fVar32 = (float)local_98;
                        fVar29 = local_138;
                        uVar25 = local_e8;
                      }
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar19 * matrix->size_ + lVar18]._M_value =
                           CONCAT44((float)((ulong)uVar23 >> 0x20) + (float)local_b8._0_4_ + fVar32
                                    + (float)((ulong)uVar24 >> 0x20),
                                    (float)uVar23 + (float)local_e8 + (float)local_d8._0_4_ +
                                    (float)uVar24);
                      fVar32 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + local_148.size_ * 2 * 8))->_M_value;
                      fVar42 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + local_148.size_ * 2 * 8))->_M_value >>
                                      0x20);
                      uVar48 = 0;
                      uVar49 = 0;
                      fVar47 = fVar36 * fVar32 - fVar27 * fVar42;
                      uVar51 = 0;
                      fVar50 = fVar36 * fVar42 + fVar27 * fVar32;
                      uVar23 = CONCAT44(fVar50,fVar47);
                      local_e8 = uVar25;
                      if ((NAN(fVar47)) && (uVar23 = CONCAT44(fVar50,fVar47), NAN(fVar50))) {
                        local_138 = fVar29;
                        local_128 = uVar14;
                        uVar23 = __mulsc3(fVar32,fVar42,fVar36,fVar27);
                        uVar51 = (undefined4)((ulong)uVar23 >> 0x20);
                        uVar14 = local_128;
                        fVar29 = local_138;
                        uVar48 = extraout_XMM0_Dc_05;
                        uVar49 = extraout_XMM0_Dd_05;
                      }
                      _Var1 = ((complex<float> *)
                              ((long)local_148.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + 8))[local_148.size_ * 2]._M_value;
                      fVar32 = (float)_Var1;
                      fVar42 = (float)(_Var1 >> 0x20);
                      uVar53 = 0;
                      uVar54 = 0;
                      fVar50 = fVar21 * fVar32 - fVar34 * fVar42;
                      fVar47 = fVar21 * fVar42 + fVar34 * fVar32;
                      uVar45 = uVar51;
                      uVar40 = uVar51;
                      uVar41 = uVar51;
                      uVar22 = (ulong)(uint)fVar50;
                      uVar25 = local_e8;
                      if ((NAN(fVar50)) && (uVar22 = (ulong)(uint)fVar50, NAN(fVar47))) {
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar51;
                        uStack_f0 = uVar51;
                        uStack_ec = uVar51;
                        uVar22 = __mulsc3(fVar32,fVar42,fVar21,fVar34);
                        uVar23 = CONCAT44(local_f8,local_118);
                        fVar47 = (float)(uVar22 >> 0x20);
                        uVar14 = local_128;
                        fVar29 = local_138;
                        uVar51 = uStack_114;
                        uVar48 = uStack_110;
                        uVar49 = uStack_10c;
                        uVar45 = uStack_f4;
                        uVar40 = uStack_f0;
                        uVar41 = uStack_ec;
                        uVar53 = extraout_XMM0_Dc_06;
                        uVar54 = extraout_XMM0_Dd_06;
                        uVar25 = local_e8;
                      }
                      local_d8._4_4_ = (undefined4)(uVar22 >> 0x20);
                      fVar32 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_148.size_ * 2 + 2) * 8))->
                                      _M_value;
                      fVar42 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_148.size_ * 2 + 2) * 8))->
                                       _M_value >> 0x20);
                      fVar50 = fVar28 * fVar32 - fVar29 * fVar42;
                      fVar33 = fVar28 * fVar42 + fVar29 * fVar32;
                      local_b8 = ZEXT416((uint)fVar33);
                      local_108 = ZEXT416((uint)fVar50);
                      local_d8._0_4_ = fVar47;
                      local_d8._8_4_ = local_d8._4_4_;
                      local_d8._12_4_ = local_d8._4_4_;
                      local_e8 = uVar22;
                      if ((NAN(fVar50)) && (NAN(fVar33))) {
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar45;
                        uStack_f0 = uVar40;
                        uStack_ec = uVar41;
                        uStack_e0 = uVar53;
                        uStack_dc = uVar54;
                        local_108._0_8_ = __mulsc3(fVar32,fVar42,fVar28,fVar29);
                        uVar23 = CONCAT44(local_f8,local_118);
                        local_b8._4_4_ = (undefined4)((ulong)local_108._0_8_ >> 0x20);
                        local_108._8_4_ = extraout_XMM0_Dc_07;
                        local_108._12_4_ = extraout_XMM0_Dd_07;
                        local_b8._0_4_ = local_b8._4_4_;
                        local_b8._8_4_ = local_b8._4_4_;
                        local_b8._12_4_ = local_b8._4_4_;
                        uVar14 = local_128;
                        fVar29 = local_138;
                        uVar51 = uStack_114;
                        uVar48 = uStack_110;
                        uVar49 = uStack_10c;
                        uVar45 = uStack_f4;
                        uVar40 = uStack_f0;
                        uVar41 = uStack_ec;
                        uVar53 = uStack_e0;
                        uVar54 = uStack_dc;
                        uVar25 = local_e8;
                      }
                      fVar42 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_148.size_ * 2 + 3) * 8))->
                                      _M_value;
                      fVar47 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_148.size_ * 2 + 3) * 8))->
                                       _M_value >> 0x20);
                      fVar32 = fVar31 * fVar42 - (float)local_c8 * fVar47;
                      fVar50 = fVar31 * fVar47 + (float)local_c8 * fVar42;
                      uVar24 = CONCAT44(fVar50,fVar32);
                      if ((NAN(fVar32)) && (uVar24 = CONCAT44(fVar50,fVar32), NAN(fVar50))) {
                        local_138 = fVar29;
                        local_128 = uVar14;
                        local_118 = (float)uVar23;
                        uStack_114 = uVar51;
                        uStack_110 = uVar48;
                        uStack_10c = uVar49;
                        local_f8 = (int)((ulong)uVar23 >> 0x20);
                        uStack_f4 = uVar45;
                        uStack_f0 = uVar40;
                        uStack_ec = uVar41;
                        uStack_e0 = uVar53;
                        uStack_dc = uVar54;
                        uVar24 = __mulsc3(fVar42,fVar47,fVar31,(float)local_c8);
                        uVar23 = CONCAT44(local_f8,local_118);
                        uVar14 = local_128;
                        fVar29 = local_138;
                        uVar25 = local_e8;
                      }
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar20 * matrix->size_ + lVar18]._M_value =
                           CONCAT44((float)((ulong)uVar23 >> 0x20) + (float)local_d8._0_4_ +
                                    (float)local_b8._0_4_ + (float)((ulong)uVar24 >> 0x20),
                                    (float)uVar23 + (float)local_e8 + (float)local_108._0_4_ +
                                    (float)uVar24);
                      _Var1 = ((complex<float> *)
                              ((long)local_148.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl + local_148.size_ * 0x18))->_M_value;
                      fVar32 = (float)_Var1;
                      fVar42 = (float)(_Var1 >> 0x20);
                      uVar48 = 0;
                      uVar49 = 0;
                      fVar47 = fVar36 * fVar32 - fVar27 * fVar42;
                      uVar51 = 0;
                      fVar50 = fVar36 * fVar42 + fVar27 * fVar32;
                      uVar23 = CONCAT44(fVar50,fVar47);
                      local_e8 = uVar25;
                      if ((NAN(fVar47)) && (uVar23 = CONCAT44(fVar50,fVar47), NAN(fVar50))) {
                        local_138 = fVar29;
                        uVar23 = __mulsc3(fVar32,fVar42,fVar36,fVar27);
                        uVar51 = (undefined4)((ulong)uVar23 >> 0x20);
                        fVar29 = local_138;
                        uVar48 = extraout_XMM0_Dc_08;
                        uVar49 = extraout_XMM0_Dd_08;
                      }
                      fVar36 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_148.size_ * 3 + 1) * 8))->
                                      _M_value;
                      fVar27 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_148.size_ * 3 + 1) * 8))->
                                       _M_value >> 0x20);
                      uVar40 = 0;
                      uVar41 = 0;
                      fVar32 = fVar21 * fVar36 - fVar34 * fVar27;
                      uVar45 = 0;
                      fVar42 = fVar21 * fVar27 + fVar34 * fVar36;
                      uVar53 = uVar51;
                      uVar54 = uVar51;
                      uVar52 = uVar51;
                      uVar24 = CONCAT44(fVar42,fVar32);
                      if ((NAN(fVar32)) && (uVar24 = CONCAT44(fVar42,fVar32), NAN(fVar42))) {
                        local_b8._4_4_ = uVar51;
                        local_b8._0_4_ = (int)uVar23;
                        local_b8._8_4_ = uVar48;
                        local_b8._12_4_ = uVar49;
                        local_d8._4_4_ = uVar51;
                        local_d8._0_4_ = (int)((ulong)uVar23 >> 0x20);
                        local_d8._8_4_ = uVar51;
                        local_d8._12_4_ = uVar51;
                        local_138 = fVar29;
                        uVar24 = __mulsc3(fVar36,fVar27,fVar21,fVar34);
                        uVar45 = (undefined4)((ulong)uVar24 >> 0x20);
                        uVar23 = CONCAT44(local_d8._0_4_,local_b8._0_4_);
                        fVar29 = local_138;
                        uVar40 = extraout_XMM0_Dc_09;
                        uVar41 = extraout_XMM0_Dd_09;
                        uVar51 = local_b8._4_4_;
                        uVar48 = local_b8._8_4_;
                        uVar49 = local_b8._12_4_;
                        uVar53 = local_d8._4_4_;
                        uVar54 = local_d8._8_4_;
                        uVar52 = local_d8._12_4_;
                      }
                      fVar36 = (float)uVar24;
                      fVar27 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_148.size_ * 3 + 2) * 8))->
                                      _M_value;
                      fVar21 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_148.size_ * 3 + 2) * 8))->
                                       _M_value >> 0x20);
                      uVar38 = 0;
                      uVar39 = 0;
                      fVar32 = fVar28 * fVar27 - fVar29 * fVar21;
                      fVar34 = fVar28 * fVar21 + fVar29 * fVar27;
                      uVar25 = (ulong)(uint)fVar32;
                      if ((NAN(fVar32)) && (uVar25 = (ulong)(uint)fVar32, NAN(fVar34))) {
                        local_b8._4_4_ = uVar51;
                        local_b8._0_4_ = (int)uVar23;
                        local_b8._8_4_ = uVar48;
                        local_b8._12_4_ = uVar49;
                        local_d8._4_4_ = uVar53;
                        local_d8._0_4_ = (int)((ulong)uVar23 >> 0x20);
                        local_d8._8_4_ = uVar54;
                        local_d8._12_4_ = uVar52;
                        local_108._4_4_ = uVar45;
                        local_108._0_4_ = fVar36;
                        local_108._8_4_ = uVar40;
                        local_108._12_4_ = uVar41;
                        uVar25 = __mulsc3(fVar27,fVar21,fVar28,fVar29);
                        fVar34 = (float)(uVar25 >> 0x20);
                        uVar23 = CONCAT44(local_d8._0_4_,local_b8._0_4_);
                        uVar38 = extraout_XMM0_Dc_10;
                        uVar39 = extraout_XMM0_Dd_10;
                        fVar36 = (float)local_108._0_4_;
                        uVar45 = local_108._4_4_;
                        uVar40 = local_108._8_4_;
                        uVar41 = local_108._12_4_;
                        uVar51 = local_b8._4_4_;
                        uVar48 = local_b8._8_4_;
                        uVar49 = local_b8._12_4_;
                        uVar53 = local_d8._4_4_;
                        uVar54 = local_d8._8_4_;
                        uVar52 = local_d8._12_4_;
                      }
                      uVar22 = CONCAT44(local_c8._4_4_,(float)local_c8);
                      fVar27 = (float)uVar25;
                      fVar28 = (float)((complex<float> *)
                                      ((long)local_148.data_._M_t.
                                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                             .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                             _M_head_impl + (local_148.size_ * 3 + 3) * 8))->
                                      _M_value;
                      fVar29 = (float)(((complex<float> *)
                                       ((long)local_148.data_._M_t.
                                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                              .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                              _M_head_impl + (local_148.size_ * 3 + 3) * 8))->
                                       _M_value >> 0x20);
                      fVar21 = fVar31 * fVar28 - (float)local_c8 * fVar29;
                      fVar32 = fVar31 * fVar29 + (float)local_c8 * fVar28;
                      uVar26 = CONCAT44(fVar32,fVar21);
                      uVar5 = local_a8._0_8_;
                      if ((NAN(fVar21)) &&
                         (uVar26 = CONCAT44(fVar32,fVar21),
                         uVar22 = CONCAT44(local_c8._4_4_,(float)local_c8), NAN(fVar32))) {
                        local_b8._4_4_ = uVar51;
                        local_b8._0_4_ = (int)uVar23;
                        local_b8._8_4_ = uVar48;
                        local_b8._12_4_ = uVar49;
                        local_d8._4_4_ = uVar53;
                        local_d8._0_4_ = (int)((ulong)uVar23 >> 0x20);
                        local_d8._8_4_ = uVar54;
                        local_d8._12_4_ = uVar52;
                        local_108._4_4_ = uVar45;
                        local_108._0_4_ = fVar36;
                        local_108._8_4_ = uVar40;
                        local_108._12_4_ = uVar41;
                        local_128 = uVar14;
                        uStack_c0 = uVar38;
                        uStack_bc = uVar39;
                        uVar26 = __mulsc3(fVar28,fVar29,fVar31,(float)local_c8);
                        local_c8 = uVar25;
                        uVar23 = CONCAT44(local_d8._0_4_,local_b8._0_4_);
                        uVar14 = local_128;
                        fVar27 = (float)local_c8;
                        fVar36 = (float)local_108._0_4_;
                        uVar22 = local_c8;
                      }
                      local_c8._4_4_ = (undefined4)(uVar22 >> 0x20);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar17 * matrix->size_ + lVar18]._M_value =
                           CONCAT44((float)((ulong)uVar23 >> 0x20) + (float)((ulong)uVar24 >> 0x20)
                                    + fVar34 + (float)((ulong)uVar26 >> 0x20),
                                    (float)uVar23 + fVar36 + fVar27 + (float)uVar26);
                      lVar16 = lVar16 + 1;
                      lVar19 = uVar5 + -1;
                    } while (lVar19 != 0);
                  }
                  uVar7 = uVar7 + 1;
                  lVar16 = local_80 + lVar9;
                } while (uVar7 != uVar14);
              }
              lVar18 = lVar18 + 1;
            } while (lVar18 < matrix->size_);
          }
        }
      }
      else if (nbQubits == 2) {
        dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_68,&local_148);
        dense::SquareMatrix<std::complex<float>_>::operator*=(&local_68,matrix);
        dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_58,&local_68);
        dense::SquareMatrix<std::complex<float>_>::operator=(matrix,&local_58);
        if ((_Head_base<0UL,_std::complex<float>_*,_false>)
            local_58.data_._M_t.
            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
            _M_t.
            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
            .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
            (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
          operator_delete__((void *)local_58.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                    .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                    _M_head_impl);
        }
        local_58.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
             (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
              )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
               0x0;
        if (local_68.data_._M_t.
            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
            _M_t.
            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
            .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0)
        {
          operator_delete__((void *)local_68.data_._M_t.
                                    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                    .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                    _M_head_impl);
        }
        uVar22 = CONCAT44(local_c8._4_4_,(float)local_c8);
        local_68.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
             (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
              )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)
               0x0;
      }
      else {
        uVar2 = local_48[0][1];
        if (0 < matrix->size_) {
          lVar12 = (long)(1 << ((byte)(~uVar2 + nbQubits) & 0x1f));
          iVar6 = *local_48[0];
          uVar13 = 1 << ((byte)iVar6 & 0x1f);
          lVar11 = 1;
          if (1 < lVar12) {
            lVar11 = lVar12;
          }
          if ((int)uVar13 < 2) {
            uVar13 = 1;
          }
          lVar18 = lVar12 * 0x20;
          local_80 = lVar12 * 0x18;
          lVar16 = 0;
          lVar9 = 0;
          do {
            local_78 = lVar9;
            if (iVar6 != 0x1f) {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = local_b8._8_8_;
              local_b8 = auVar4 << 0x40;
              uVar14 = 0;
              lVar9 = lVar12 << 4;
              lVar19 = lVar12 * 8;
              lVar20 = local_80;
              do {
                local_c8._4_4_ = (undefined4)(uVar22 >> 0x20);
                local_70 = uVar14;
                if (~uVar2 + nbQubits != 0x1f) {
                  lVar17 = 0;
                  do {
                    lVar8 = matrix->size_ * lVar16;
                    pcVar3 = (matrix->data_)._M_t.
                             super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                             .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                    fVar36 = *(float *)((long)&pcVar3->_M_value + lVar17 + local_b8._0_8_ + lVar8);
                    fVar27 = *(float *)((long)&pcVar3->_M_value +
                                       lVar17 + 4 + local_b8._0_8_ + lVar8);
                    fVar21 = *(float *)((long)&pcVar3->_M_value + lVar17 + lVar19 + lVar8);
                    fVar34 = *(float *)((long)&pcVar3->_M_value + lVar17 + 4 + lVar19 + lVar8);
                    fVar28 = *(float *)((long)&pcVar3->_M_value + lVar17 + lVar9 + lVar8);
                    fVar29 = *(float *)((long)&pcVar3->_M_value + lVar17 + 4 + lVar9 + lVar8);
                    local_c8._0_4_ = *(float *)((long)&pcVar3->_M_value + lVar17 + lVar20 + lVar8);
                    fVar31 = *(float *)((long)&pcVar3->_M_value + lVar17 + 4 + lVar20 + lVar8);
                    fVar32 = (float)*(_ComplexT *)
                                     local_148.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl;
                    fVar42 = (float)(*(_ComplexT *)
                                      local_148.data_._M_t.
                                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                      .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl >> 0x20);
                    uVar48 = 0;
                    uVar49 = 0;
                    fVar47 = fVar36 * fVar32 - fVar27 * fVar42;
                    uVar51 = 0;
                    fVar50 = fVar36 * fVar42 + fVar27 * fVar32;
                    uVar23 = CONCAT44(fVar50,fVar47);
                    if ((NAN(fVar47)) && (uVar23 = CONCAT44(fVar50,fVar47), NAN(fVar50))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      uVar23 = __mulsc3(fVar32,fVar42,fVar36,fVar27);
                      uVar51 = (undefined4)((ulong)uVar23 >> 0x20);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar48 = extraout_XMM0_Dc_11;
                      uVar49 = extraout_XMM0_Dd_11;
                    }
                    fVar47 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + local_148.size_ * 8))->_M_value;
                    fVar50 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + local_148.size_ * 8))->_M_value >> 0x20);
                    fVar32 = 0.0;
                    fVar42 = 0.0;
                    fVar30 = fVar21 * fVar47 - fVar34 * fVar50;
                    fVar33 = fVar21 * fVar50 + fVar34 * fVar47;
                    uVar45 = uVar51;
                    uVar40 = uVar51;
                    uVar41 = uVar51;
                    uVar22 = (ulong)(uint)fVar30;
                    uVar14 = local_98;
                    if ((NAN(fVar30)) && (uVar22 = (ulong)(uint)fVar30, NAN(fVar33))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar51;
                      uStack_e0 = uVar51;
                      uStack_dc = uVar51;
                      uVar22 = __mulsc3(fVar47,fVar50,fVar21,fVar34);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      fVar33 = (float)(uVar22 >> 0x20);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar51 = uStack_f4;
                      uVar48 = uStack_f0;
                      uVar49 = uStack_ec;
                      uVar45 = local_e8._4_4_;
                      uVar40 = uStack_e0;
                      uVar41 = uStack_dc;
                      fVar32 = extraout_XMM0_Dc_12;
                      fVar42 = extraout_XMM0_Dd_12;
                      uVar14 = local_98;
                    }
                    local_d8._4_4_ = (undefined4)(uVar22 >> 0x20);
                    fVar47 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + local_148.size_ * 2 * 8))->_M_value;
                    fVar50 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + local_148.size_ * 2 * 8))->_M_value >>
                                    0x20);
                    fVar30 = fVar28 * fVar47 - fVar29 * fVar50;
                    fVar35 = fVar28 * fVar50 + fVar29 * fVar47;
                    local_a8 = ZEXT416((uint)fVar35);
                    local_108 = ZEXT416((uint)fVar30);
                    local_d8._0_4_ = fVar33;
                    local_d8._8_4_ = local_d8._4_4_;
                    local_d8._12_4_ = local_d8._4_4_;
                    local_98 = uVar22;
                    if ((NAN(fVar30)) && (NAN(fVar35))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar45;
                      uStack_e0 = uVar40;
                      uStack_dc = uVar41;
                      fStack_90 = fVar32;
                      fStack_8c = fVar42;
                      local_108._0_8_ = __mulsc3(fVar47,fVar50,fVar28,fVar29);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      local_a8._4_4_ = (undefined4)((ulong)local_108._0_8_ >> 0x20);
                      local_108._8_4_ = extraout_XMM0_Dc_13;
                      local_108._12_4_ = extraout_XMM0_Dd_13;
                      local_a8._0_4_ = local_a8._4_4_;
                      local_a8._8_4_ = local_a8._4_4_;
                      local_a8._12_4_ = local_a8._4_4_;
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar51 = uStack_f4;
                      uVar48 = uStack_f0;
                      uVar49 = uStack_ec;
                      uVar45 = local_e8._4_4_;
                      uVar40 = uStack_e0;
                      uVar41 = uStack_dc;
                      fVar32 = fStack_90;
                      fVar42 = fStack_8c;
                      uVar14 = local_98;
                    }
                    _Var1 = ((complex<float> *)
                            ((long)local_148.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                            + local_148.size_ * 0x18))->_M_value;
                    fVar50 = (float)_Var1;
                    fVar33 = (float)(_Var1 >> 0x20);
                    fVar47 = (float)local_c8 * fVar50 - fVar31 * fVar33;
                    fVar30 = (float)local_c8 * fVar33 + fVar31 * fVar50;
                    uVar24 = CONCAT44(fVar30,fVar47);
                    if ((NAN(fVar47)) && (uVar24 = CONCAT44(fVar30,fVar47), NAN(fVar30))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar45;
                      uStack_e0 = uVar40;
                      uStack_dc = uVar41;
                      fStack_90 = fVar32;
                      fStack_8c = fVar42;
                      uVar24 = __mulsc3(fVar50,fVar33,(float)local_c8,fVar31);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar14 = local_98;
                    }
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              lVar17 + local_b8._0_8_ + matrix->size_ * lVar16) =
                         CONCAT44((float)((ulong)uVar23 >> 0x20) + (float)local_d8._0_4_ +
                                  (float)local_a8._0_4_ + (float)((ulong)uVar24 >> 0x20),
                                  (float)uVar23 + (float)local_98 + (float)local_108._0_4_ +
                                  (float)uVar24);
                    fVar32 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + 8))->_M_value;
                    fVar42 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 8))->_M_value >> 0x20);
                    uVar48 = 0;
                    uVar49 = 0;
                    fVar47 = fVar36 * fVar32 - fVar27 * fVar42;
                    uVar51 = 0;
                    fVar50 = fVar36 * fVar42 + fVar27 * fVar32;
                    uVar23 = CONCAT44(fVar50,fVar47);
                    local_98 = uVar14;
                    if ((NAN(fVar47)) && (uVar23 = CONCAT44(fVar50,fVar47), NAN(fVar50))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      uVar23 = __mulsc3(fVar32,fVar42,fVar36,fVar27);
                      uVar51 = (undefined4)((ulong)uVar23 >> 0x20);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar48 = extraout_XMM0_Dc_14;
                      uVar49 = extraout_XMM0_Dd_14;
                    }
                    fVar47 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_148.size_ + 1) * 8))->_M_value;
                    fVar50 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_148.size_ + 1) * 8))->_M_value >>
                                    0x20);
                    fVar32 = 0.0;
                    fVar42 = 0.0;
                    fVar30 = fVar21 * fVar47 - fVar34 * fVar50;
                    fVar33 = fVar21 * fVar50 + fVar34 * fVar47;
                    uVar45 = uVar51;
                    uVar40 = uVar51;
                    uVar41 = uVar51;
                    uVar22 = (ulong)(uint)fVar30;
                    uVar14 = local_98;
                    if ((NAN(fVar30)) && (uVar22 = (ulong)(uint)fVar30, NAN(fVar33))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar51;
                      uStack_e0 = uVar51;
                      uStack_dc = uVar51;
                      uVar22 = __mulsc3(fVar47,fVar50,fVar21,fVar34);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      fVar33 = (float)(uVar22 >> 0x20);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar51 = uStack_f4;
                      uVar48 = uStack_f0;
                      uVar49 = uStack_ec;
                      uVar45 = local_e8._4_4_;
                      uVar40 = uStack_e0;
                      uVar41 = uStack_dc;
                      fVar32 = extraout_XMM0_Dc_15;
                      fVar42 = extraout_XMM0_Dd_15;
                      uVar14 = local_98;
                    }
                    local_a8._4_4_ = (undefined4)(uVar22 >> 0x20);
                    _Var1 = ((complex<float> *)
                            ((long)local_148.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                            + 8))[local_148.size_ * 2]._M_value;
                    fVar47 = (float)_Var1;
                    fVar50 = (float)(_Var1 >> 0x20);
                    fVar30 = fVar28 * fVar47 - fVar29 * fVar50;
                    fVar35 = fVar28 * fVar50 + fVar29 * fVar47;
                    local_d8 = ZEXT416((uint)fVar30);
                    local_a8._0_4_ = fVar33;
                    local_a8._8_4_ = local_a8._4_4_;
                    local_a8._12_4_ = local_a8._4_4_;
                    local_108 = ZEXT416((uint)fVar35);
                    local_98 = uVar22;
                    if ((NAN(fVar30)) && (NAN(fVar35))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar45;
                      uStack_e0 = uVar40;
                      uStack_dc = uVar41;
                      fStack_90 = fVar32;
                      fStack_8c = fVar42;
                      local_d8._0_8_ = __mulsc3(fVar47,fVar50,fVar28,fVar29);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      local_108._4_4_ = (undefined4)((ulong)local_d8._0_8_ >> 0x20);
                      local_d8._8_4_ = extraout_XMM0_Dc_16;
                      local_d8._12_4_ = extraout_XMM0_Dd_16;
                      local_108._0_4_ = local_108._4_4_;
                      local_108._8_4_ = local_108._4_4_;
                      local_108._12_4_ = local_108._4_4_;
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar51 = uStack_f4;
                      uVar48 = uStack_f0;
                      uVar49 = uStack_ec;
                      uVar45 = local_e8._4_4_;
                      uVar40 = uStack_e0;
                      uVar41 = uStack_dc;
                      fVar32 = fStack_90;
                      fVar42 = fStack_8c;
                      uVar14 = local_98;
                    }
                    fVar50 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_148.size_ * 3 + 1) * 8))->_M_value;
                    fVar33 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_148.size_ * 3 + 1) * 8))->_M_value
                                    >> 0x20);
                    fVar47 = (float)local_c8 * fVar50 - fVar31 * fVar33;
                    fVar30 = (float)local_c8 * fVar33 + fVar31 * fVar50;
                    uVar24 = CONCAT44(fVar30,fVar47);
                    if ((NAN(fVar47)) && (uVar24 = CONCAT44(fVar30,fVar47), NAN(fVar30))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar45;
                      uStack_e0 = uVar40;
                      uStack_dc = uVar41;
                      fStack_90 = fVar32;
                      fStack_8c = fVar42;
                      uVar24 = __mulsc3(fVar50,fVar33,(float)local_c8,fVar31);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar14 = local_98;
                    }
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              lVar17 + lVar19 + matrix->size_ * lVar16) =
                         CONCAT44((float)((ulong)uVar23 >> 0x20) + (float)local_a8._0_4_ +
                                  (float)local_108._0_4_ + (float)((ulong)uVar24 >> 0x20),
                                  (float)uVar23 + (float)local_98 + (float)local_d8._0_4_ +
                                  (float)uVar24);
                    fVar32 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + 0x10))->_M_value;
                    fVar42 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 0x10))->_M_value >> 0x20);
                    uVar48 = 0;
                    uVar49 = 0;
                    fVar47 = fVar36 * fVar32 - fVar27 * fVar42;
                    uVar51 = 0;
                    fVar50 = fVar36 * fVar42 + fVar27 * fVar32;
                    uVar23 = CONCAT44(fVar50,fVar47);
                    local_98 = uVar14;
                    if ((NAN(fVar47)) && (uVar23 = CONCAT44(fVar50,fVar47), NAN(fVar50))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      uVar23 = __mulsc3(fVar32,fVar42,fVar36,fVar27);
                      uVar51 = (undefined4)((ulong)uVar23 >> 0x20);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar48 = extraout_XMM0_Dc_17;
                      uVar49 = extraout_XMM0_Dd_17;
                    }
                    _Var1 = ((complex<float> *)
                            ((long)local_148.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                            + 0x10))[local_148.size_]._M_value;
                    fVar47 = (float)_Var1;
                    fVar50 = (float)(_Var1 >> 0x20);
                    fVar32 = 0.0;
                    fVar42 = 0.0;
                    fVar30 = fVar21 * fVar47 - fVar34 * fVar50;
                    fVar33 = fVar21 * fVar50 + fVar34 * fVar47;
                    uVar45 = uVar51;
                    uVar40 = uVar51;
                    uVar41 = uVar51;
                    uVar22 = (ulong)(uint)fVar30;
                    uVar14 = local_98;
                    if ((NAN(fVar30)) && (uVar22 = (ulong)(uint)fVar30, NAN(fVar33))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar51;
                      uStack_e0 = uVar51;
                      uStack_dc = uVar51;
                      uVar22 = __mulsc3(fVar47,fVar50,fVar21,fVar34);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      fVar33 = (float)(uVar22 >> 0x20);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar51 = uStack_f4;
                      uVar48 = uStack_f0;
                      uVar49 = uStack_ec;
                      uVar45 = local_e8._4_4_;
                      uVar40 = uStack_e0;
                      uVar41 = uStack_dc;
                      fVar32 = extraout_XMM0_Dc_18;
                      fVar42 = extraout_XMM0_Dd_18;
                      uVar14 = local_98;
                    }
                    local_a8._4_4_ = (undefined4)(uVar22 >> 0x20);
                    fVar47 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_148.size_ * 2 + 2) * 8))->_M_value;
                    fVar50 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_148.size_ * 2 + 2) * 8))->_M_value
                                    >> 0x20);
                    fVar30 = fVar28 * fVar47 - fVar29 * fVar50;
                    fVar35 = fVar28 * fVar50 + fVar29 * fVar47;
                    local_d8 = ZEXT416((uint)fVar30);
                    local_a8._0_4_ = fVar33;
                    local_a8._8_4_ = local_a8._4_4_;
                    local_a8._12_4_ = local_a8._4_4_;
                    local_108 = ZEXT416((uint)fVar35);
                    local_98 = uVar22;
                    if ((NAN(fVar30)) && (NAN(fVar35))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar45;
                      uStack_e0 = uVar40;
                      uStack_dc = uVar41;
                      fStack_90 = fVar32;
                      fStack_8c = fVar42;
                      local_d8._0_8_ = __mulsc3(fVar47,fVar50,fVar28,fVar29);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      local_108._4_4_ = (undefined4)((ulong)local_d8._0_8_ >> 0x20);
                      local_d8._8_4_ = extraout_XMM0_Dc_19;
                      local_d8._12_4_ = extraout_XMM0_Dd_19;
                      local_108._0_4_ = local_108._4_4_;
                      local_108._8_4_ = local_108._4_4_;
                      local_108._12_4_ = local_108._4_4_;
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar51 = uStack_f4;
                      uVar48 = uStack_f0;
                      uVar49 = uStack_ec;
                      uVar45 = local_e8._4_4_;
                      uVar40 = uStack_e0;
                      uVar41 = uStack_dc;
                      fVar32 = fStack_90;
                      fVar42 = fStack_8c;
                      uVar14 = local_98;
                    }
                    fVar50 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_148.size_ * 3 + 2) * 8))->_M_value;
                    fVar33 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_148.size_ * 3 + 2) * 8))->_M_value
                                    >> 0x20);
                    fVar47 = (float)local_c8 * fVar50 - fVar31 * fVar33;
                    fVar30 = (float)local_c8 * fVar33 + fVar31 * fVar50;
                    uVar24 = CONCAT44(fVar30,fVar47);
                    if ((NAN(fVar47)) && (uVar24 = CONCAT44(fVar30,fVar47), NAN(fVar30))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      local_118 = fVar27;
                      local_f8 = (int)uVar23;
                      uStack_f4 = uVar51;
                      uStack_f0 = uVar48;
                      uStack_ec = uVar49;
                      local_e8._0_4_ = (float)(int)((ulong)uVar23 >> 0x20);
                      local_e8._4_4_ = uVar45;
                      uStack_e0 = uVar40;
                      uStack_dc = uVar41;
                      fStack_90 = fVar32;
                      fStack_8c = fVar42;
                      uVar24 = __mulsc3(fVar50,fVar33,(float)local_c8,fVar31);
                      uVar23 = CONCAT44((float)local_e8,local_f8);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      fVar27 = local_118;
                      uVar14 = local_98;
                    }
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              lVar17 + lVar9 + matrix->size_ * lVar16) =
                         CONCAT44((float)((ulong)uVar23 >> 0x20) + (float)local_a8._0_4_ +
                                  (float)local_108._0_4_ + (float)((ulong)uVar24 >> 0x20),
                                  (float)uVar23 + (float)local_98 + (float)local_d8._0_4_ +
                                  (float)uVar24);
                    fVar32 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + 0x18))->_M_value;
                    fVar42 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 0x18))->_M_value >> 0x20);
                    uVar48 = 0;
                    uVar49 = 0;
                    fVar47 = fVar36 * fVar32 - fVar27 * fVar42;
                    uVar51 = 0;
                    fVar50 = fVar36 * fVar42 + fVar27 * fVar32;
                    uVar23 = CONCAT44(fVar50,fVar47);
                    local_98 = uVar14;
                    if ((NAN(fVar47)) && (uVar23 = CONCAT44(fVar50,fVar47), NAN(fVar50))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_138 = fVar31;
                      uVar23 = __mulsc3(fVar32,fVar42,fVar36,fVar27);
                      uVar51 = (undefined4)((ulong)uVar23 >> 0x20);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      uVar48 = extraout_XMM0_Dc_20;
                      uVar49 = extraout_XMM0_Dd_20;
                    }
                    fVar36 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_148.size_ + 3) * 8))->_M_value;
                    fVar27 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_148.size_ + 3) * 8))->_M_value >>
                                    0x20);
                    uVar40 = 0;
                    uVar41 = 0;
                    fVar32 = fVar21 * fVar36 - fVar34 * fVar27;
                    uVar45 = 0;
                    fVar42 = fVar21 * fVar27 + fVar34 * fVar36;
                    uVar53 = uVar51;
                    uVar54 = uVar51;
                    uVar52 = uVar51;
                    uVar24 = CONCAT44(fVar42,fVar32);
                    if ((NAN(fVar32)) && (uVar24 = CONCAT44(fVar42,fVar32), NAN(fVar42))) {
                      local_128 = CONCAT44(local_128._4_4_,fVar28);
                      local_a8._4_4_ = uVar51;
                      local_a8._0_4_ = (int)uVar23;
                      local_a8._8_4_ = uVar48;
                      local_a8._12_4_ = uVar49;
                      local_d8._4_4_ = uVar51;
                      local_d8._0_4_ = (int)((ulong)uVar23 >> 0x20);
                      local_d8._8_4_ = uVar51;
                      local_d8._12_4_ = uVar51;
                      local_138 = fVar31;
                      uVar24 = __mulsc3(fVar36,fVar27,fVar21,fVar34);
                      uVar45 = (undefined4)((ulong)uVar24 >> 0x20);
                      uVar23 = CONCAT44(local_d8._0_4_,local_a8._0_4_);
                      fVar28 = (float)local_128;
                      fVar31 = local_138;
                      uVar40 = extraout_XMM0_Dc_21;
                      uVar41 = extraout_XMM0_Dd_21;
                      uVar51 = local_a8._4_4_;
                      uVar48 = local_a8._8_4_;
                      uVar49 = local_a8._12_4_;
                      uVar53 = local_d8._4_4_;
                      uVar54 = local_d8._8_4_;
                      uVar52 = local_d8._12_4_;
                    }
                    _Var1 = ((complex<float> *)
                            ((long)local_148.data_._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                            + 0x18))[local_148.size_ * 2]._M_value;
                    fVar27 = (float)_Var1;
                    fVar21 = (float)(_Var1 >> 0x20);
                    uVar38 = 0;
                    uVar39 = 0;
                    fVar34 = fVar28 * fVar27 - fVar29 * fVar21;
                    fVar36 = fVar28 * fVar21 + fVar29 * fVar27;
                    uVar43 = uVar45;
                    uVar44 = uVar45;
                    uVar46 = uVar45;
                    uVar14 = (ulong)(uint)fVar34;
                    if ((NAN(fVar34)) && (uVar14 = (ulong)(uint)fVar34, NAN(fVar36))) {
                      local_a8._4_4_ = uVar51;
                      local_a8._0_4_ = (int)uVar23;
                      local_a8._8_4_ = uVar48;
                      local_a8._12_4_ = uVar49;
                      local_d8._4_4_ = uVar53;
                      local_d8._0_4_ = (int)((ulong)uVar23 >> 0x20);
                      local_d8._8_4_ = uVar54;
                      local_d8._12_4_ = uVar52;
                      local_108._4_4_ = uVar45;
                      local_108._0_4_ = (int)uVar24;
                      local_108._8_4_ = uVar40;
                      local_108._12_4_ = uVar41;
                      local_128 = CONCAT44(uVar45,(int)((ulong)uVar24 >> 0x20));
                      local_138 = fVar31;
                      uStack_120 = uVar45;
                      uStack_11c = uVar45;
                      uVar14 = __mulsc3(fVar27,fVar21,fVar28,fVar29);
                      fVar36 = (float)(uVar14 >> 0x20);
                      uVar24 = CONCAT44((float)local_128,local_108._0_4_);
                      uVar23 = CONCAT44(local_d8._0_4_,local_a8._0_4_);
                      fVar31 = local_138;
                      uVar38 = extraout_XMM0_Dc_22;
                      uVar39 = extraout_XMM0_Dd_22;
                      uVar45 = local_108._4_4_;
                      uVar40 = local_108._8_4_;
                      uVar41 = local_108._12_4_;
                      uVar43 = local_128._4_4_;
                      uVar44 = uStack_120;
                      uVar46 = uStack_11c;
                      uVar51 = local_a8._4_4_;
                      uVar48 = local_a8._8_4_;
                      uVar49 = local_a8._12_4_;
                      uVar53 = local_d8._4_4_;
                      uVar54 = local_d8._8_4_;
                      uVar52 = local_d8._12_4_;
                    }
                    uVar37 = (undefined4)(uVar14 >> 0x20);
                    fVar34 = (float)((complex<float> *)
                                    ((long)local_148.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl + (local_148.size_ * 3 + 3) * 8))->_M_value;
                    fVar28 = (float)(((complex<float> *)
                                     ((long)local_148.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + (local_148.size_ * 3 + 3) * 8))->_M_value
                                    >> 0x20);
                    fVar21 = (float)local_c8 * fVar34 - fVar31 * fVar28;
                    fVar29 = (float)local_c8 * fVar28 + fVar31 * fVar34;
                    fVar27 = (float)uVar14;
                    uVar26 = CONCAT44(fVar29,fVar21);
                    uVar22 = CONCAT44(local_c8._4_4_,(float)local_c8);
                    if ((NAN(fVar21)) &&
                       (uVar26 = CONCAT44(fVar29,fVar21),
                       uVar22 = CONCAT44(local_c8._4_4_,(float)local_c8), NAN(fVar29))) {
                      local_a8._4_4_ = uVar51;
                      local_a8._0_4_ = (int)uVar23;
                      local_a8._8_4_ = uVar48;
                      local_a8._12_4_ = uVar49;
                      local_d8._4_4_ = uVar53;
                      local_d8._0_4_ = (int)((ulong)uVar23 >> 0x20);
                      local_d8._8_4_ = uVar54;
                      local_d8._12_4_ = uVar52;
                      local_108._4_4_ = uVar45;
                      local_108._0_4_ = (int)uVar24;
                      local_108._8_4_ = uVar40;
                      local_108._12_4_ = uVar41;
                      local_128 = CONCAT44(uVar43,(int)((ulong)uVar24 >> 0x20));
                      local_138 = fVar36;
                      uStack_134 = uVar37;
                      uStack_130 = uVar37;
                      uStack_12c = uVar37;
                      uStack_120 = uVar44;
                      uStack_11c = uVar46;
                      uStack_c0 = uVar38;
                      uStack_bc = uVar39;
                      uVar26 = __mulsc3(fVar34,fVar28,(float)local_c8,fVar31);
                      local_c8 = uVar14;
                      uVar24 = CONCAT44((float)local_128,local_108._0_4_);
                      uVar23 = CONCAT44(local_d8._0_4_,local_a8._0_4_);
                      fVar36 = local_138;
                      fVar27 = (float)local_c8;
                      uVar22 = local_c8;
                    }
                    local_c8._4_4_ = (undefined4)(uVar22 >> 0x20);
                    *(ulong *)((long)&((matrix->data_)._M_t.
                                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                       .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                      _M_head_impl)->_M_value +
                              lVar17 + lVar20 + matrix->size_ * lVar16) =
                         CONCAT44((float)((ulong)uVar23 >> 0x20) + (float)((ulong)uVar24 >> 0x20) +
                                  fVar36 + (float)((ulong)uVar26 >> 0x20),
                                  (float)uVar23 + (float)uVar24 + fVar27 + (float)uVar26);
                    lVar17 = lVar17 + 8;
                  } while (lVar11 << 3 != lVar17);
                }
                uVar14 = local_70 + 1;
                local_b8._0_8_ = local_b8._0_8_ + lVar18;
                lVar20 = lVar20 + lVar18;
                lVar19 = lVar19 + lVar18;
                lVar9 = lVar9 + lVar18;
              } while (uVar14 != uVar13);
            }
            lVar9 = local_78 + 1;
            lVar16 = lVar16 + 8;
          } while (lVar9 < matrix->size_);
        }
      }
      local_c8 = uVar22;
      if (local_148.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
        operator_delete__((void *)local_148.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
        ;
      }
      if (local_48[0] != (int *)0x0) {
        operator_delete(local_48[0],local_38 - (long)local_48[0]);
      }
      return;
    }
    __assertion = "qubits[1] < nbQubits";
  }
  else {
    __assertion = "qubits[0] < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                ,0x28,
                "virtual void qclab::qgates::QGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }